

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb.cc
# Opt level: O0

void CB_EVAL::copy_label(void *dst,void *src)

{
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  label *ldS;
  label *ldD;
  
  CB::copy_label(in_RSI,in_RDI);
  *in_RDI = *in_RSI;
  return;
}

Assistant:

void copy_label(void* dst, void* src)
{
  CB_EVAL::label* ldD = (CB_EVAL::label*)dst;
  CB_EVAL::label* ldS = (CB_EVAL::label*)src;
  CB::copy_label(&(ldD->event), &(ldS)->event);
  ldD->action = ldS->action;
}